

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,value_type_conflict4 index,
          aiNode *parent,aiNode *root_node,aiMatrix4x4 *absolute_transform)

{
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  _Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *p_Var9;
  ShapeGeometry *this_00;
  aiAnimMesh *paVar10;
  key_type kVar11;
  bool bVar12;
  aiMesh *out;
  MatIndexArray *this_01;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_03;
  ImportSettings *pIVar13;
  Skin *pSVar14;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar15
  ;
  size_type sVar16;
  aiVector3D *paVar17;
  ulong *puVar18;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_04;
  size_type sVar19;
  ulong uVar20;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_05;
  const_reference pvVar21;
  const_reference v2;
  reference pvVar22;
  aiColor4D *paVar23;
  reference puVar24;
  reference piVar25;
  pointer paVar26;
  reference pvVar27;
  float *pfVar28;
  const_reference pvVar29;
  const_reference pvVar30;
  reference ppBVar31;
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  *this_06;
  reference ppBVar32;
  aiAnimMesh *paVar33;
  const_reference ppSVar34;
  string *name;
  const_reference pvVar35;
  mapped_type *pmVar36;
  aiAnimMesh **ppaVar37;
  reference ppaVar38;
  bool bVar39;
  aiVector3t<float> aVar40;
  float local_540;
  aiColor4t<float> *local_460;
  aiVector3t<float> *local_430;
  aiVector3t<float> *local_400;
  aiVector3t<float> *local_3d8;
  aiVector3t<float> *local_360;
  aiFace *local_328;
  aiVector3t<float> *local_2f8;
  size_type local_2c8;
  size_t i_5;
  size_t numAnimMeshes;
  iterator iStack_2b0;
  uint index_2;
  _Self local_2a8;
  uint local_2a0;
  uint local_29c;
  uint outIndex;
  uint k;
  uint *outIndices;
  undefined1 auStack_288 [4];
  uint count;
  aiVector3D normal;
  aiVector3D vertex;
  uint index_1;
  size_t j_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals_1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices_1;
  ShapeGeometry *shapeGeometry;
  aiAnimMesh *animMesh;
  size_t i_4;
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  *shapeGeometries;
  BlendShapeChannel *blendShapeChannel;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  *__range3;
  BlendShape *blendShape;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
  *__range2;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *cols;
  uint j_1;
  float local_19c;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *local_198;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *uvs_1;
  uint j;
  uint i_3;
  aiFace *f;
  const_iterator cStack_178;
  uint pcount;
  const_iterator end_1;
  const_iterator it_1;
  key_type local_160;
  float local_15c;
  uint in_cursor;
  uint cursor;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *colors;
  uint i_2;
  uint num_vcs;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *uvs;
  uint i_1;
  uint num_uvs;
  float local_130;
  undefined8 local_128;
  float local_120;
  uint local_11c;
  undefined1 local_118 [4];
  uint i;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *binormals;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *tangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *normals;
  aiFace *fac;
  undefined1 local_d0 [8];
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  translateIndexMap;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reverseMapping;
  const_iterator end;
  const_iterator it;
  const_iterator itf;
  uint local_68;
  uint count_vertices;
  uint count_faces;
  bool process_weights;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faces;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vertices;
  MatIndexArray *mindices;
  aiMesh *out_mesh;
  aiNode *root_node_local;
  aiNode *parent_local;
  value_type_conflict4 index_local;
  Model *model_local;
  MeshGeometry *mesh_local;
  FBXConverter *this_local;
  
  out = SetupEmptyMesh(this,&mesh->super_Geometry,parent);
  this_01 = MeshGeometry::GetMaterialIndices(mesh);
  this_02 = MeshGeometry::GetVertices(mesh);
  this_03 = MeshGeometry::GetFaceIndexCounts(mesh);
  pIVar13 = Document::Settings(this->doc);
  bVar39 = false;
  if ((pIVar13->readWeights & 1U) != 0) {
    pSVar14 = Geometry::DeformerSkin(&mesh->super_Geometry);
    bVar39 = pSVar14 != (Skin *)0x0;
  }
  local_68 = 0;
  itf._M_current._4_4_ = 0;
  it._M_current = (int *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_03);
  end = std::vector<int,_std::allocator<int>_>::begin(this_01);
  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end(this_01);
  while (bVar12 = __gnu_cxx::operator!=
                            (&end,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)&reverseMapping.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar12) {
    piVar25 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&end);
    if (*piVar25 == index) {
      local_68 = local_68 + 1;
      puVar24 = __gnu_cxx::
                __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)&it);
      itf._M_current._4_4_ = *puVar24 + itf._M_current._4_4_;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&end);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)&it);
  }
  if (local_68 == 0) {
    __assert_fail("count_faces",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x50e,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                 );
  }
  if (itf._M_current._4_4_ == 0) {
    __assert_fail("count_vertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x50f,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                 );
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         *)local_d0);
  if (!bVar39) {
    pvVar15 = Geometry::GetBlendShapes(&mesh->super_Geometry);
    sVar16 = std::
             vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             ::size(pvVar15);
    if (sVar16 == 0) goto LAB_009f02b6;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ulong)itf._M_current._4_4_);
LAB_009f02b6:
  out->mNumVertices = itf._M_current._4_4_;
  uVar20 = (ulong)itf._M_current._4_4_;
  paVar17 = (aiVector3D *)operator_new__(uVar20 * 0xc);
  if (uVar20 != 0) {
    local_2f8 = paVar17;
    do {
      aiVector3t<float>::aiVector3t(local_2f8);
      local_2f8 = local_2f8 + 1;
    } while (local_2f8 != paVar17 + uVar20);
  }
  out->mVertices = paVar17;
  out->mNumFaces = local_68;
  uVar20 = (ulong)local_68;
  puVar18 = (ulong *)operator_new__(uVar20 << 4 | 8);
  *puVar18 = uVar20;
  normals = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(puVar18 + 1);
  if (uVar20 != 0) {
    local_328 = (aiFace *)normals;
    do {
      aiFace::aiFace(local_328);
      local_328 = local_328 + 1;
    } while (local_328 != (aiFace *)((long)normals + uVar20 * 0x10));
  }
  out->mFaces = (aiFace *)normals;
  this_04 = MeshGeometry::GetNormals(mesh);
  sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_04);
  if (sVar16 != 0) {
    sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_04);
    sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
    if (sVar16 != sVar19) {
      __assert_fail("normals.size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x523,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                   );
    }
    sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar16;
    uVar20 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar20 = 0xffffffffffffffff;
    }
    paVar17 = (aiVector3D *)operator_new__(uVar20);
    if (sVar16 != 0) {
      local_360 = paVar17;
      do {
        aiVector3t<float>::aiVector3t(local_360);
        local_360 = local_360 + 1;
      } while (local_360 != paVar17 + sVar16);
    }
    out->mNormals = paVar17;
  }
  this_05 = MeshGeometry::GetTangents(mesh);
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)MeshGeometry::GetBinormals(mesh);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_118);
  sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_05);
  if (sVar16 != 0) {
    sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        tempBinormals.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar16 == 0) {
      sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_04);
      if (sVar16 == 0) {
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_04);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_118,
                   sVar16);
        for (local_11c = 0; uVar20 = (ulong)local_11c,
            sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                               (this_05), uVar20 < sVar16; local_11c = local_11c + 1) {
          pvVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              (this_04,(ulong)local_11c);
          v2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (this_05,(ulong)local_11c);
          aVar40 = operator^(pvVar21,v2);
          local_130 = aVar40.z;
          _i_1 = aVar40._0_8_;
          local_128 = _i_1;
          local_120 = local_130;
          pvVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_118,(ulong)local_11c);
          pvVar22->x = (float)(undefined4)local_128;
          pvVar22->y = (float)local_128._4_4_;
          pvVar22->z = local_120;
        }
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_118;
      }
    }
    if (tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_05);
      sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
      bVar12 = false;
      if (sVar16 == sVar19) {
        sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            tempBinormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
        bVar12 = sVar16 == sVar19;
      }
      if (!bVar12) {
        __assert_fail("tangents.size() == vertices.size() && binormals->size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0x53e,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                     );
      }
      sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar16;
      uVar20 = SUB168(auVar4 * ZEXT816(0xc),0);
      if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
        uVar20 = 0xffffffffffffffff;
      }
      paVar17 = (aiVector3D *)operator_new__(uVar20);
      if (sVar16 != 0) {
        local_3d8 = paVar17;
        do {
          aiVector3t<float>::aiVector3t(local_3d8);
          local_3d8 = local_3d8 + 1;
        } while (local_3d8 != paVar17 + sVar16);
      }
      out->mTangents = paVar17;
      sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sVar16;
      uVar20 = SUB168(auVar5 * ZEXT816(0xc),0);
      if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
        uVar20 = 0xffffffffffffffff;
      }
      paVar17 = (aiVector3D *)operator_new__(uVar20);
      if (sVar16 != 0) {
        local_400 = paVar17;
        do {
          aiVector3t<float>::aiVector3t(local_400);
          local_400 = local_400 + 1;
        } while (local_400 != paVar17 + sVar16);
      }
      out->mBitangents = paVar17;
    }
  }
  uvs._4_4_ = 0;
  for (uvs._0_4_ = 0; (uint)uvs < 8; uvs._0_4_ = (uint)uvs + 1) {
    _i_2 = MeshGeometry::GetTextureCoords(mesh,(uint)uvs);
    bVar12 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::empty(_i_2);
    if (bVar12) break;
    sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = sVar16;
    uVar20 = SUB168(auVar6 * ZEXT816(0xc),0);
    if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
      uVar20 = 0xffffffffffffffff;
    }
    paVar17 = (aiVector3D *)operator_new__(uVar20);
    if (sVar16 != 0) {
      local_430 = paVar17;
      do {
        aiVector3t<float>::aiVector3t(local_430);
        local_430 = local_430 + 1;
      } while (local_430 != paVar17 + sVar16);
    }
    out->mTextureCoords[(uint)uvs] = paVar17;
    out->mNumUVComponents[(uint)uvs] = 2;
    uvs._4_4_ = uvs._4_4_ + 1;
  }
  colors._4_4_ = 0;
  for (colors._0_4_ = 0; (uint)colors < 8; colors._0_4_ = (uint)colors + 1) {
    _in_cursor = MeshGeometry::GetVertexColors(mesh,(uint)colors);
    bVar12 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::empty(_in_cursor);
    if (bVar12) break;
    sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(this_02);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = sVar16;
    uVar20 = SUB168(auVar7 * ZEXT816(0x10),0);
    if (SUB168(auVar7 * ZEXT816(0x10),8) != 0) {
      uVar20 = 0xffffffffffffffff;
    }
    paVar23 = (aiColor4D *)operator_new__(uVar20);
    if (sVar16 != 0) {
      local_460 = paVar23;
      do {
        aiColor4t<float>::aiColor4t(local_460);
        local_460 = local_460 + 1;
      } while (local_460 != paVar23 + sVar16);
    }
    out->mColors[(uint)colors] = paVar23;
    colors._4_4_ = colors._4_4_ + 1;
  }
  local_15c = 0.0;
  local_160 = 0;
  it._M_current = (int *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_03);
  end_1 = std::vector<int,_std::allocator<int>_>::begin(this_01);
  cStack_178 = std::vector<int,_std::allocator<int>_>::end(this_01);
  while (bVar12 = __gnu_cxx::operator!=(&end_1,&stack0xfffffffffffffe88), bVar12) {
    puVar24 = __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           *)&it);
    f._4_4_ = *puVar24;
    piVar25 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&end_1);
    if (*piVar25 == index) {
      p_Var9 = &normals->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>;
      _j = normals;
      *(uint *)&(normals->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start = f._4_4_;
      paVar26 = (pointer)operator_new__((ulong)f._4_4_ << 2);
      (_j->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = paVar26;
      if (f._4_4_ == 1) {
        out->mPrimitiveTypes = out->mPrimitiveTypes | 1;
      }
      else if (f._4_4_ == 2) {
        out->mPrimitiveTypes = out->mPrimitiveTypes | 2;
      }
      else if (f._4_4_ == 3) {
        out->mPrimitiveTypes = out->mPrimitiveTypes | 4;
      }
      else {
        out->mPrimitiveTypes = out->mPrimitiveTypes | 8;
      }
      for (uvs_1._4_4_ = 0;
          normals = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    &(p_Var9->_M_impl).super__Vector_impl_data._M_end_of_storage,
          uvs_1._4_4_ < f._4_4_; uvs_1._4_4_ = uvs_1._4_4_ + 1) {
        (&((_j->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
           super__Vector_impl_data._M_finish)->x)[uvs_1._4_4_] = local_15c;
        sVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        kVar11 = local_160;
        if (sVar16 != 0) {
          pvVar27 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (ulong)(uint)local_15c);
          fVar1 = local_15c;
          *pvVar27 = kVar11;
          pfVar28 = (float *)std::
                             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                           *)local_d0,&local_160);
          *pfVar28 = fVar1;
        }
        pvVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            (this_02,(ulong)local_160);
        paVar17 = out->mVertices + (uint)local_15c;
        fVar1 = pvVar21->y;
        paVar17->x = pvVar21->x;
        paVar17->y = fVar1;
        paVar17->z = pvVar21->z;
        if (out->mNormals != (aiVector3D *)0x0) {
          pvVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              (this_04,(ulong)local_160);
          paVar17 = out->mNormals + (uint)local_15c;
          fVar1 = pvVar21->y;
          paVar17->x = pvVar21->x;
          paVar17->y = fVar1;
          paVar17->z = pvVar21->z;
        }
        if (out->mTangents != (aiVector3D *)0x0) {
          pvVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              (this_05,(ulong)local_160);
          paVar17 = out->mTangents + (uint)local_15c;
          fVar1 = pvVar21->y;
          paVar17->x = pvVar21->x;
          paVar17->y = fVar1;
          paVar17->z = pvVar21->z;
          pvVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               tempBinormals.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_160);
          paVar17 = out->mBitangents + (uint)local_15c;
          fVar1 = pvVar21->y;
          paVar17->x = pvVar21->x;
          paVar17->y = fVar1;
          paVar17->z = pvVar21->z;
        }
        for (uvs_1._0_4_ = 0; (uint)uvs_1 < uvs._4_4_; uvs_1._0_4_ = (uint)uvs_1 + 1) {
          local_198 = MeshGeometry::GetTextureCoords(mesh,(uint)uvs_1);
          pvVar29 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                              (local_198,(ulong)local_160);
          fVar1 = pvVar29->x;
          pvVar29 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                              (local_198,(ulong)local_160);
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&cols + 4),fVar1,pvVar29->y,0.0)
          ;
          paVar17 = out->mTextureCoords[(uint)uvs_1] + (uint)local_15c;
          paVar17->x = (float)cols._4_4_;
          paVar17->y = (float)j_1;
          paVar17->z = local_19c;
        }
        for (cols._0_4_ = 0; (uint)cols < colors._4_4_; cols._0_4_ = (uint)cols + 1) {
          animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)MeshGeometry::GetVertexColors(mesh,(uint)cols);
          pvVar30 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                               animMeshes.
                               super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_160);
          paVar23 = out->mColors[(uint)cols] + (uint)local_15c;
          fVar1 = pvVar30->g;
          paVar23->r = pvVar30->r;
          paVar23->g = fVar1;
          fVar1 = pvVar30->a;
          paVar23->b = pvVar30->b;
          paVar23->a = fVar1;
        }
        local_15c = (float)((int)local_15c + 1);
        local_160 = local_160 + 1;
      }
    }
    else {
      local_160 = f._4_4_ + local_160;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&end_1);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)&it);
  }
  ConvertMaterialForMesh(this,out,model,mesh,index);
  if (bVar39) {
    ConvertWeights(this,out,model,mesh,absolute_transform,parent,root_node,index,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::vector
            ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2);
  pvVar15 = Geometry::GetBlendShapes(&mesh->super_Geometry);
  __end2 = std::
           vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
           ::begin(pvVar15);
  blendShape = (BlendShape *)
               std::
               vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
               ::end(pvVar15);
  while (bVar39 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<const_Assimp::FBX::BlendShape_*const_*,_std::vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>_>
                                      *)&blendShape), bVar39) {
    ppBVar31 = __gnu_cxx::
               __normal_iterator<const_Assimp::FBX::BlendShape_*const_*,_std::vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>_>
               ::operator*(&__end2);
    this_06 = BlendShape::BlendShapeChannels(*ppBVar31);
    __end3 = std::
             vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
             ::begin(this_06);
    blendShapeChannel =
         (BlendShapeChannel *)
         std::
         vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
         ::end(this_06);
    while (bVar39 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
                                        *)&blendShapeChannel), bVar39) {
      ppBVar32 = __gnu_cxx::
                 __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
                 ::operator*(&__end3);
      shapeGeometries =
           (vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
            *)*ppBVar32;
      i_4 = (size_t)BlendShapeChannel::GetShapeGeometries((BlendShapeChannel *)shapeGeometries);
      for (animMesh = (aiAnimMesh *)0x0; paVar10 = animMesh,
          paVar33 = (aiAnimMesh *)
                    std::
                    vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                    ::size((vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                            *)i_4), paVar10 < paVar33;
          animMesh = (aiAnimMesh *)((long)&(animMesh->mName).length + 1)) {
        shapeGeometry = (ShapeGeometry *)aiCreateAnimMesh(out);
        ppSVar34 = std::
                   vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                   ::at((vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                         *)i_4,(size_type)animMesh);
        vertices_1 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)*ppSVar34;
        normals_1 = ShapeGeometry::GetVertices((ShapeGeometry *)vertices_1);
        indices = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ShapeGeometry::GetNormals((ShapeGeometry *)vertices_1);
        local_240 = ShapeGeometry::GetIndices((ShapeGeometry *)vertices_1);
        this_00 = shapeGeometry;
        name = FBX::Object::Name_abi_cxx11_((Object *)vertices_1);
        FixAnimMeshName((string *)&j_2,this,name);
        aiString::Set((aiString *)this_00,(string *)&j_2);
        std::__cxx11::string::~string((string *)&j_2);
        for (stack0xfffffffffffffd98 = 0;
            sVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_240),
            stack0xfffffffffffffd98 < sVar16; register0x00000000 = stack0xfffffffffffffd98 + 1) {
          pvVar35 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (local_240,stack0xfffffffffffffd98);
          uVar2 = *pvVar35;
          pvVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              (normals_1,stack0xfffffffffffffd98);
          normal.z = pvVar21->x;
          unique0x00012004 = pvVar21->y;
          pvVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               indices,stack0xfffffffffffffd98);
          normal.x = pvVar21->z;
          auStack_288 = pvVar21->x;
          unique0x00012004 = pvVar21->y;
          outIndices._4_4_ = 0;
          _outIndex = MeshGeometry::ToOutputVertexIndex(mesh,uVar2,(uint *)((long)&outIndices + 4));
          for (local_29c = 0; local_29c < outIndices._4_4_; local_29c = local_29c + 1) {
            local_2a0 = _outIndex[local_29c];
            local_2a8._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::find((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)local_d0,&local_2a0);
            iStack_2b0 = std::
                         map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)local_d0);
            bVar39 = std::operator==(&local_2a8,&stack0xfffffffffffffd50);
            if (!bVar39) {
              pmVar36 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                      *)local_d0,&local_2a0);
              uVar2 = *pmVar36;
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)
                         ((long)shapeGeometry[6].super_Geometry.blendShapes.
                                super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + (ulong)uVar2 * 0xc),
                         (aiVector3t<float> *)&normal.z);
              if (shapeGeometry[6].super_Geometry.blendShapes.
                  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                aiVector3t<float>::operator+=
                          ((aiVector3t<float> *)
                           ((long)shapeGeometry[6].super_Geometry.blendShapes.
                                  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage +
                           (ulong)uVar2 * 0xc),(aiVector3t<float> *)auStack_288);
                aiVector3t<float>::NormalizeSafe
                          ((aiVector3t<float> *)
                           ((long)shapeGeometry[6].super_Geometry.blendShapes.
                                  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage +
                           (ulong)uVar2 * 0xc));
              }
            }
          }
        }
        sVar16 = std::
                 vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                 ::size((vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                         *)i_4);
        if (sVar16 < 2) {
          local_540 = 1.0;
        }
        else {
          local_540 = BlendShapeChannel::DeformPercent((BlendShapeChannel *)shapeGeometries);
          local_540 = local_540 / 100.0;
        }
        *(float *)((long)&shapeGeometry[7].super_Geometry.blendShapes.
                          super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = local_540;
        std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::push_back
                  ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2,
                   (value_type *)&shapeGeometry);
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::BlendShape_*const_*,_std::vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>_>
    ::operator++(&__end2);
  }
  sVar16 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::size
                     ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2);
  if (sVar16 != 0) {
    i_5._0_4_ = (uint)sVar16;
    out->mNumAnimMeshes = (uint)i_5;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = sVar16;
    uVar20 = SUB168(auVar8 * ZEXT816(8),0);
    if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
      uVar20 = 0xffffffffffffffff;
    }
    ppaVar37 = (aiAnimMesh **)operator_new__(uVar20);
    out->mAnimMeshes = ppaVar37;
    for (local_2c8 = 0; local_2c8 < sVar16; local_2c8 = local_2c8 + 1) {
      ppaVar38 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::at
                           ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2,
                            local_2c8);
      out->mAnimMeshes[local_2c8] = *ppaVar38;
    }
  }
  sVar16 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->meshes);
  std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::~vector
            ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)&__range2);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_118);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *)local_d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (int)sVar16 - 1;
}

Assistant:

unsigned int FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &mesh, const Model &model,
                                                            MatIndexArray::value_type index,
                                                            aiNode *parent, aiNode *root_node,
                                                            const aiMatrix4x4 &absolute_transform)
        {
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, parent);

            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            const bool process_weights = doc.Settings().readWeights && mesh.DeformerSkin() != nullptr;

            unsigned int count_faces = 0;
            unsigned int count_vertices = 0;

            // count faces
            std::vector<unsigned int>::const_iterator itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(),
                end = mindices.end(); it != end; ++it, ++itf)
            {
                if ((*it) != index) {
                    continue;
                }
                ++count_faces;
                count_vertices += *itf;
            }

            ai_assert(count_faces);
            ai_assert(count_vertices);

            // mapping from output indices to DOM indexing, needed to resolve weights or blendshapes
            std::vector<unsigned int> reverseMapping;
            std::map<unsigned int, unsigned int> translateIndexMap;
            if (process_weights || mesh.GetBlendShapes().size() > 0) {
                reverseMapping.resize(count_vertices);
            }

            // allocate output data arrays, but don't fill them yet
            out_mesh->mNumVertices = count_vertices;
            out_mesh->mVertices = new aiVector3D[count_vertices];

            out_mesh->mNumFaces = count_faces;
            aiFace* fac = out_mesh->mFaces = new aiFace[count_faces]();


            // allocate normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());
                out_mesh->mNormals = new aiVector3D[vertices.size()];
            }

            // allocate tangents, binormals.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();
            std::vector<aiVector3D> tempBinormals;

            if (tangents.size()) {
                if (!binormals->size()) {
                    if (normals.size()) {
                        // XXX this computes the binormals for the entire mesh, not only
                        // the part for which we need them.
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = nullptr;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size() && binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                }
            }

            // allocate texture coords
            unsigned int num_uvs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i, ++num_uvs) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                out_mesh->mNumUVComponents[i] = 2;
            }

            // allocate vertex colors
            unsigned int num_vcs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i, ++num_vcs) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
            }

            unsigned int cursor = 0, in_cursor = 0;

            itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(), end = mindices.end(); it != end; ++it, ++itf)
            {
                const unsigned int pcount = *itf;
                if ((*it) != index) {
                    in_cursor += pcount;
                    continue;
                }

                aiFace& f = *fac++;

                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i, ++cursor, ++in_cursor) {
                    f.mIndices[i] = cursor;

                    if (reverseMapping.size()) {
                        reverseMapping[cursor] = in_cursor;
                        translateIndexMap[in_cursor] = cursor;
                    }

                    out_mesh->mVertices[cursor] = vertices[in_cursor];

                    if (out_mesh->mNormals) {
                        out_mesh->mNormals[cursor] = normals[in_cursor];
                    }

                    if (out_mesh->mTangents) {
                        out_mesh->mTangents[cursor] = tangents[in_cursor];
                        out_mesh->mBitangents[cursor] = (*binormals)[in_cursor];
                    }

                    for (unsigned int j = 0; j < num_uvs; ++j) {
                        const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(j);
                        out_mesh->mTextureCoords[j][cursor] = aiVector3D(uvs[in_cursor].x, uvs[in_cursor].y, 0.0f);
                    }

                    for (unsigned int j = 0; j < num_vcs; ++j) {
                        const std::vector<aiColor4D>& cols = mesh.GetVertexColors(j);
                        out_mesh->mColors[j][cursor] = cols[in_cursor];
                    }
                }
            }

            ConvertMaterialForMesh(out_mesh, model, mesh, index);

            if (process_weights) {
                ConvertWeights(out_mesh, model, mesh, absolute_transform, parent, root_node, index, &reverseMapping);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh* animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int outIndex = outIndices[k];
                                if (translateIndexMap.find(outIndex) == translateIndexMap.end())
                                    continue;
                                unsigned int index = translateIndexMap[outIndex];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }

            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }

            return static_cast<unsigned int>(meshes.size() - 1);
        }